

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.hpp
# Opt level: O0

int32_t __thiscall Script::add_or_find_model(Script *this,string_view *name)

{
  optional<int32_t> this_00;
  bool bVar1;
  int *piVar2;
  pointer ppVar3;
  size_type local_80 [3];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  local_40;
  const_iterator local_38;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  local_30;
  undefined1 local_28 [8];
  optional<int32_t> opt;
  string_view *name_local;
  Script *this_local;
  
  opt.super_OptionalBase<int> = (OptionalBase<int>)name;
  find_model((Script *)local_28,(string_view *)this);
  bVar1 = std::experimental::optional::operator_cast_to_bool((optional *)local_28);
  if (bVar1) {
    piVar2 = std::experimental::optional<int>::operator*((optional<int> *)local_28);
    this_local._4_4_ = *piVar2;
  }
  else {
    local_40._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::end(&this->models);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::string,int>const*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>
    ::__normal_iterator<std::pair<std::__cxx11::string,int>*>
              ((__normal_iterator<std::pair<std::__cxx11::string,int>const*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>
                *)&local_38,&local_40);
    this_00 = opt;
    std::allocator<char>::allocator();
    libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
    to_string<std::allocator<char>>
              (&local_60,
               (basic_string_view<char,std::char_traits<char>> *)this_00.super_OptionalBase<int>,
               &local_61);
    local_80[0] = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::size(&this->models);
    local_30._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *)std::
            vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
            ::emplace<std::__cxx11::string,unsigned_long>
                      ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                        *)&this->models,local_38,&local_60,local_80);
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
             ::operator->(&local_30);
    this_local._4_4_ = ppVar3->second;
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return this_local._4_4_;
}

Assistant:

int32_t add_or_find_model(const string_view& name)
    {
        if(auto opt = this->find_model(name))
            return *opt;
        return this->models.emplace(models.end(), name.to_string(), models.size())->second;
    }